

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O2

void setup_mem(MIR_mem_t mem,int *mod,int *rm,int *scale,int *base,int *rex_b,int *index,int *rex_x,
              int *disp8,int64_t *disp32)

{
  uint uVar1;
  
  if (((-1 < *disp8) || (-1 < *disp32)) || (mem.index == 4)) {
    __assert_fail("*disp8 < 0 && *disp32 < 0 && mem.index != SP_HARD_REG",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                  ,0x891,
                  "void setup_mem(MIR_mem_t, int *, int *, int *, int *, int *, int *, int *, int *, int64_t *)"
                 );
  }
  if ((mem.index & mem.base) == 0xffffffff) {
    setup_r((int *)0x0,rm,4);
    *disp32 = mem.disp & 0xffffffff;
    setup_r((int *)0x0,base,5);
    setup_r((int *)0x0,index,4);
    return;
  }
  if ((mem.base & 0xfffffff7) == 4 || mem.index != 0xffffffff) {
    setup_r((int *)0x0,rm,4);
    if (mem.index == 0xffffffff) {
      setup_r((int *)0x0,index,4);
      setup_r(rex_b,base,mem.base);
      if (mem.disp != 0) goto LAB_001478e4;
      goto LAB_001479ac;
    }
    if (mem.base == 0xffffffff) {
      setup_r(rex_x,index,mem.index);
      uVar1 = 0;
      setup_r((int *)0x0,base,5);
      setup_mod(mod,0);
      *disp32 = mem.disp & 0xffffffff;
      if (mem.scale != '\x01') {
        if (mem.scale == '\x02') {
          uVar1 = 1;
        }
        else {
          uVar1 = mem.scale == '\x04' ^ 3;
        }
      }
      setup_scale(scale,uVar1);
      return;
    }
    setup_r(rex_b,base,mem.base);
    setup_r(rex_x,index,mem.index);
    if (mem.scale == '\x01') {
      uVar1 = 0;
    }
    else if (mem.scale == '\x02') {
      uVar1 = 1;
    }
    else {
      uVar1 = mem.scale == '\x04' ^ 3;
    }
    setup_scale(scale,uVar1);
  }
  else {
    setup_r(rex_b,rm,mem.base);
  }
  if ((mem.base & 0xfffffff7) == 5 || mem.disp != 0) {
LAB_001478e4:
    if ((char)mem.disp == mem.disp) {
      setup_mod(mod,1);
      *disp8 = (uint)mem.disp & 0xff;
    }
    else {
      setup_mod(mod,2);
      *disp32 = mem.disp & 0xffffffff;
    }
    return;
  }
LAB_001479ac:
  setup_mod(mod,0);
  return;
}

Assistant:

static void setup_mem (MIR_mem_t mem, int *mod, int *rm, int *scale, int *base, int *rex_b,
                       int *index, int *rex_x, int *disp8, int64_t *disp32) {
  MIR_disp_t disp = mem.disp;

  gen_assert (*disp8 < 0 && *disp32 < 0 && mem.index != SP_HARD_REG);
  if (mem.index == MIR_NON_VAR && mem.base == MIR_NON_VAR) { /* SIB: disp only */
    setup_rm (NULL, rm, 4);
    *disp32 = (uint32_t) disp;
    setup_base (NULL, base, BP_HARD_REG);
    setup_index (NULL, index, SP_HARD_REG);
  } else if (mem.index == MIR_NON_VAR && mem.base != SP_HARD_REG && mem.base != R12_HARD_REG) {
    setup_rm (rex_b, rm, mem.base);
    if (disp == 0 && mem.base != BP_HARD_REG && mem.base != R13_HARD_REG) {
      setup_mod (mod, 0);
    } else if (int8_p (disp)) {
      setup_mod (mod, 1);
      *disp8 = (uint8_t) disp;
    } else {
      setup_mod (mod, 2);
      *disp32 = (uint32_t) disp;
    }
  } else if (mem.index == MIR_NON_VAR) { /* SIB: only base = sp or r12 */
    setup_rm (NULL, rm, 4);
    setup_index (NULL, index, SP_HARD_REG);
    setup_base (rex_b, base, mem.base);
    if (disp == 0) {
      setup_mod (mod, 0);
    } else if (int8_p (disp)) {
      setup_mod (mod, 1);
      *disp8 = (uint8_t) disp;
    } else {
      setup_mod (mod, 2);
      *disp32 = (uint32_t) disp;
    }
  } else if (mem.base == MIR_NON_VAR) { /* SIB: index with scale only */
    setup_rm (NULL, rm, 4);
    setup_index (rex_x, index, mem.index);
    setup_base (NULL, base, BP_HARD_REG);
    setup_mod (mod, 0);
    *disp32 = (uint32_t) disp;
    setup_scale (scale, mem.scale == 1 ? 0 : mem.scale == 2 ? 1 : mem.scale == 4 ? 2 : 3);
  } else { /* SIB: base and index */
    setup_rm (NULL, rm, 4);
    setup_base (rex_b, base, mem.base);
    setup_index (rex_x, index, mem.index);
    setup_scale (scale, mem.scale == 1 ? 0 : mem.scale == 2 ? 1 : mem.scale == 4 ? 2 : 3);
    if (disp == 0 && mem.base != BP_HARD_REG && mem.base != R13_HARD_REG) {
      setup_mod (mod, 0);
    } else if (int8_p (disp)) {
      setup_mod (mod, 1);
      *disp8 = (uint8_t) disp;
    } else {
      setup_mod (mod, 2);
      *disp32 = (uint32_t) disp;
    }
  }
}